

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void BZ2_blockSort(EState *s)

{
  int iVar1;
  int local_6c;
  UInt32 local_4c;
  Int32 i;
  Int32 budgetInit;
  Int32 budget;
  UInt16 *quadrant;
  Int32 local_30;
  Int32 wfact;
  Int32 verb;
  Int32 nblock;
  UInt32 *ftab;
  UChar *block;
  UInt32 *ptr;
  EState *s_local;
  
  block = (UChar *)s->ptr;
  ftab = (UInt32 *)s->block;
  _verb = s->ftab;
  wfact = s->nblock;
  local_30 = s->verbosity;
  quadrant._4_4_ = s->workFactor;
  ptr = (UInt32 *)s;
  if (wfact < 10000) {
    fallbackSort(s->arr1,s->arr2,_verb,wfact,local_30);
  }
  else {
    local_4c = wfact + 0x22;
    if ((local_4c & 1) != 0) {
      local_4c = wfact + 0x23;
    }
    _budgetInit = (UInt16 *)((long)ftab + (long)(int)local_4c);
    if (quadrant._4_4_ < 1) {
      quadrant._4_4_ = 1;
    }
    if (100 < quadrant._4_4_) {
      quadrant._4_4_ = 100;
    }
    iVar1 = wfact * ((quadrant._4_4_ + -1) / 3);
    i = iVar1;
    mainSort((UInt32 *)block,(UChar *)ftab,_budgetInit,_verb,wfact,local_30,&i);
    if (2 < local_30) {
      if (wfact == 0) {
        local_6c = 1;
      }
      else {
        local_6c = wfact;
      }
      fprintf(_stderr,"      %d work, %d block, ratio %5.2f\n",
              (double)((float)(iVar1 - i) / (float)local_6c),(ulong)(uint)(iVar1 - i),
              (ulong)(uint)wfact);
    }
    if (i < 0) {
      if (1 < local_30) {
        fprintf(_stderr,"    too repetitive; using fallback sorting algorithm\n");
      }
      fallbackSort(*(UInt32 **)(ptr + 6),*(UInt32 **)(ptr + 8),_verb,wfact,local_30);
    }
  }
  ptr[0xc] = 0xffffffff;
  local_4c = 0;
  do {
    if ((int)ptr[0x1b] <= (int)local_4c) {
LAB_00902d7e:
      if (ptr[0xc] == 0xffffffff) {
        BZ2_bz__AssertH__fail(0x3eb);
      }
      return;
    }
    if (*(int *)(block + (long)(int)local_4c * 4) == 0) {
      ptr[0xc] = local_4c;
      goto LAB_00902d7e;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}